

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O1

void __thiscall slang::parsing::ParserBase::Window::addNew(Window *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Token *pTVar4;
  size_t sVar5;
  Token *pTVar6;
  undefined8 uVar7;
  ulong uVar8;
  Token TVar9;
  
  uVar1 = this->count;
  uVar2 = this->capacity;
  if (uVar2 <= uVar1) {
    uVar3 = this->currentOffset;
    if (uVar2 >> 1 < uVar3) {
      if (uVar1 != uVar3) {
        memmove(this->buffer,this->buffer + uVar3,(uVar1 - uVar3) * 0x10);
      }
    }
    else {
      uVar8 = uVar2 * 2;
      this->capacity = uVar8;
      pTVar6 = (Token *)operator_new__(-(ulong)(uVar8 >> 0x3c != 0) | uVar2 << 5);
      if (uVar8 != 0) {
        uVar8 = 0;
        do {
          Token::Token((Token *)((long)&pTVar6->kind + uVar8));
          uVar8 = uVar8 + 0x10;
        } while (uVar2 << 5 != uVar8);
      }
      pTVar4 = this->buffer;
      memcpy(pTVar6,pTVar4 + this->currentOffset,(uVar1 - uVar3) * 0x10);
      if (pTVar4 != (Token *)0x0) {
        operator_delete__(pTVar4);
      }
      this->buffer = pTVar6;
    }
    this->count = this->count - this->currentOffset;
    this->currentOffset = 0;
  }
  TVar9 = Preprocessor::next(this->tokenSource);
  uVar7 = TVar9._0_8_;
  pTVar4 = this->buffer;
  sVar5 = this->count;
  pTVar6 = pTVar4 + sVar5;
  pTVar6->kind = (short)uVar7;
  pTVar6->field_0x2 = (char)((ulong)uVar7 >> 0x10);
  pTVar6->numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  pTVar6->rawLen = (int)((ulong)uVar7 >> 0x20);
  pTVar4[sVar5].info = TVar9.info;
  this->count = this->count + 1;
  return;
}

Assistant:

void ParserBase::Window::addNew() {
    if (count >= capacity) {
        // shift tokens to the left if we are too far to the right
        size_t shift = count - currentOffset;
        if (currentOffset > (capacity >> 1)) {
            if (shift > 0)
                memmove(buffer, buffer + currentOffset, shift * sizeof(Token));
        }
        else {
            capacity *= 2;
            Token* newBuffer = new Token[capacity];
            memcpy(newBuffer, buffer + currentOffset, shift * sizeof(Token));

            delete[] buffer;
            buffer = newBuffer;
        }

        count -= currentOffset;
        currentOffset = 0;
    }

    buffer[count] = tokenSource.next();
    count++;
}